

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O2

IterateResult __thiscall gl4cts::DirectStateAccess::Buffers::ErrorsTest::iterate(ErrorsTest *this)

{
  PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE p_Var1;
  PFNGLCOPYNAMEDBUFFERSUBDATA p_Var2;
  PFNGLMAPNAMEDBUFFER p_Var3;
  PFNGLMAPNAMEDBUFFERRANGE p_Var4;
  PFNGLNAMEDBUFFERDATA p_Var5;
  PFNGLNAMEDBUFFERSTORAGE p_Var6;
  PFNGLNAMEDBUFFERSUBDATA p_Var7;
  PFNGLUNMAPNAMEDBUFFER p_Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  bool bVar26;
  bool bVar27;
  bool bVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  bool bVar33;
  int iVar34;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar36;
  undefined4 uVar37;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  long lVar35;
  
  iVar34 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar35 = CONCAT44(extraout_var,iVar34);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar20 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar21 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access"
                     );
  if ((bVar20) || (bVar21)) {
    iVar34 = *(int *)(lVar35 + 0x1d8);
    iVar9 = *(int *)(lVar35 + 0x1dc);
    iVar10 = *(int *)(lVar35 + 0x1e0);
    iVar11 = *(int *)(lVar35 + 0x1e4);
    p_Var1 = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar35 + 0x660);
    p_Var2 = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar35 + 0x340);
    *(int *)&this->m_pClearNamedBufferData = iVar34;
    *(int *)((long)&this->m_pClearNamedBufferData + 4) = iVar9;
    *(int *)&this->m_pClearNamedBufferSubData = iVar10;
    *(int *)((long)&this->m_pClearNamedBufferSubData + 4) = iVar11;
    this->m_pCopyNamedBufferSubData = p_Var2;
    this->m_pFlushMappedNamedBufferRange = p_Var1;
    iVar12 = *(int *)(lVar35 + 0x8f0);
    iVar13 = *(int *)(lVar35 + 0x8f4);
    iVar14 = *(int *)(lVar35 + 0x8f8);
    iVar15 = *(int *)(lVar35 + 0x8fc);
    *(int *)&this->m_pGetNamedBufferParameteri64v = iVar12;
    *(int *)((long)&this->m_pGetNamedBufferParameteri64v + 4) = iVar13;
    *(int *)&this->m_pGetNamedBufferParameteriv = iVar14;
    *(int *)((long)&this->m_pGetNamedBufferParameteriv + 4) = iVar15;
    iVar16 = *(int *)(lVar35 + 0x900);
    iVar17 = *(int *)(lVar35 + 0x904);
    iVar18 = *(int *)(lVar35 + 0x908);
    iVar19 = *(int *)(lVar35 + 0x90c);
    *(int *)&this->m_pGetNamedBufferPointerv = iVar16;
    *(int *)((long)&this->m_pGetNamedBufferPointerv + 4) = iVar17;
    *(int *)&this->m_pGetNamedBufferSubData = iVar18;
    *(int *)((long)&this->m_pGetNamedBufferSubData + 4) = iVar19;
    p_Var3 = *(PFNGLMAPNAMEDBUFFER *)(lVar35 + 0xd08);
    this->m_pMapNamedBuffer = p_Var3;
    p_Var4 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar35 + 0xd10);
    this->m_pMapNamedBufferRange = p_Var4;
    p_Var5 = *(PFNGLNAMEDBUFFERDATA *)(lVar35 + 0xec0);
    this->m_pNamedBufferData = p_Var5;
    p_Var6 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar35 + 0xed8);
    this->m_pNamedBufferStorage = p_Var6;
    p_Var7 = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar35 + 0xee0);
    this->m_pNamedBufferSubData = p_Var7;
    p_Var8 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar35 + 0x1678);
    this->m_pUnmapNamedBuffer = p_Var8;
    auVar43._0_4_ = -(uint)(iVar34 == 0);
    auVar43._4_4_ = -(uint)(iVar9 == 0);
    auVar43._8_4_ = -(uint)(iVar10 == 0);
    auVar43._12_4_ = -(uint)(iVar11 == 0);
    auVar45._4_4_ = auVar43._0_4_;
    auVar45._0_4_ = auVar43._4_4_;
    auVar45._8_4_ = auVar43._12_4_;
    auVar45._12_4_ = auVar43._8_4_;
    auVar46._0_4_ = -(uint)((int)p_Var2 == 0);
    auVar46._4_4_ = -(uint)((int)((ulong)p_Var2 >> 0x20) == 0);
    auVar46._8_4_ = -(uint)((int)p_Var1 == 0);
    auVar46._12_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == 0);
    auVar44._4_4_ = auVar46._0_4_;
    auVar44._0_4_ = auVar46._4_4_;
    auVar44._8_4_ = auVar46._12_4_;
    auVar44._12_4_ = auVar46._8_4_;
    auVar46 = packssdw(auVar45 & auVar43,auVar44 & auVar46);
    auVar38._0_4_ = -(uint)(iVar12 == 0);
    auVar38._4_4_ = -(uint)(iVar13 == 0);
    auVar38._8_4_ = -(uint)(iVar14 == 0);
    auVar38._12_4_ = -(uint)(iVar15 == 0);
    auVar41._4_4_ = auVar38._0_4_;
    auVar41._0_4_ = auVar38._4_4_;
    auVar41._8_4_ = auVar38._12_4_;
    auVar41._12_4_ = auVar38._8_4_;
    auVar42._0_4_ = -(uint)(iVar16 == 0);
    auVar42._4_4_ = -(uint)(iVar17 == 0);
    auVar42._8_4_ = -(uint)(iVar18 == 0);
    auVar42._12_4_ = -(uint)(iVar19 == 0);
    auVar39._4_4_ = auVar42._0_4_;
    auVar39._0_4_ = auVar42._4_4_;
    auVar39._8_4_ = auVar42._12_4_;
    auVar39._12_4_ = auVar42._8_4_;
    auVar42 = packssdw(auVar41 & auVar38,auVar39 & auVar42);
    auVar42 = packssdw(auVar46,auVar42);
    if (((((((((auVar42 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar42 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar42 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar42 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar42 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar42 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar42 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar42[0xf] < '\0')
       || (((auVar40._0_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == 0 && (int)p_Var3 == 0),
            auVar40._4_4_ = -(uint)((int)p_Var4 == 0 && (int)((ulong)p_Var4 >> 0x20) == 0),
            auVar40._8_4_ = -(uint)((int)((ulong)p_Var5 >> 0x20) == 0 && (int)p_Var5 == 0),
            auVar40._12_4_ = -(uint)((int)p_Var6 == 0 && (int)((ulong)p_Var6 >> 0x20) == 0),
            uVar37 = movmskps((int)p_Var3,auVar40), (char)uVar37 != '\0' ||
            (p_Var7 == (PFNGLNAMEDBUFFERSUBDATA)0x0)) || (p_Var8 == (PFNGLUNMAPNAMEDBUFFER)0x0)))) {
      puVar36 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar36 = 0;
      __cxa_throw(puVar36,&int::typeinfo,0);
    }
    bVar20 = TestErrorsOfClearNamedBufferData(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar21 = TestErrorsOfClearNamedBufferSubData(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar22 = TestErrorsOfCopyNamedBufferSubData(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar23 = TestErrorsOfCreateBuffers(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar24 = TestErrorsOfFlushMappedNamedBufferRange(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar25 = TestErrorsOfGetNamedBufferParameter(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar26 = TestErrorsOfGetNamedBufferPointerv(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar27 = TestErrorsOfGetNamedBufferSubData(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar28 = TestErrorsOfMapNamedBuffer(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar29 = TestErrorsOfMapNamedBufferRange(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar30 = TestErrorsOfNamedBufferData(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar31 = TestErrorsOfNamedBufferStorage(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar32 = TestErrorsOfNamedBufferSubData(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    bVar33 = TestErrorsOfUnmapNamedBuffer(this);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    do {
      iVar34 = (**(code **)(lVar35 + 0x800))();
    } while (iVar34 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (((((((((((((bVar20 && bVar21) && bVar22) && bVar23) && bVar24) && bVar25) && bVar26) &&
             bVar27) && bVar28) && bVar29) && bVar30) && bVar31) && bVar32) && bVar33) {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
    else {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult ErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* API function pointers setup. */
	m_pClearNamedBufferData		   = (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData	 = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;
	m_pCopyNamedBufferSubData	  = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;
	m_pGetNamedBufferSubData	   = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;
	m_pMapNamedBuffer			   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pNamedBufferSubData		   = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		/* API function pointers check. */
		if ((DE_NULL == m_pClearNamedBufferData) || (DE_NULL == m_pClearNamedBufferSubData) ||
			(DE_NULL == m_pCopyNamedBufferSubData) || (DE_NULL == m_pFlushMappedNamedBufferRange) ||
			(DE_NULL == m_pGetNamedBufferParameteri64v) || (DE_NULL == m_pGetNamedBufferParameteriv) ||
			(DE_NULL == m_pGetNamedBufferPointerv) || (DE_NULL == m_pGetNamedBufferSubData) ||
			(DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pMapNamedBufferRange) || (DE_NULL == m_pNamedBufferData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Running test cases.                              Cleaning errors. */
		is_ok &= TestErrorsOfClearNamedBufferData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfClearNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfCopyNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfCreateBuffers();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfFlushMappedNamedBufferRange();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferParameter();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferPointerv();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfGetNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfMapNamedBuffer();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfMapNamedBufferRange();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferStorage();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfNamedBufferSubData();
		while (gl.getError())
			;
		is_ok &= TestErrorsOfUnmapNamedBuffer();
		while (gl.getError())
			;
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}